

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O0

int __thiscall ncnn::Gemm_x86_avx512::create_pipeline(Gemm_x86_avx512 *this,Option *opt)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 *puVar6;
  long *plVar7;
  byte *in_RSI;
  long *in_RDI;
  bool bVar8;
  int i_1;
  int size;
  Mat C2;
  int C_elempack;
  int in_stack_000001b0;
  int in_stack_000001b4;
  int in_stack_000001b8;
  int in_stack_000001bc;
  Mat *in_stack_000001c0;
  Mat *in_stack_000001c8;
  Mat BT_tile;
  int max_kk_1;
  int max_jj;
  int k_1;
  int j;
  int ppk;
  int ppj_1;
  int ppjk;
  int nn_NK;
  int nn_K;
  int nn_N;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int K_1;
  int N;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  int i;
  int ppj;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  int in_stack_00000820;
  int in_stack_00000824;
  int in_stack_00000828;
  int in_stack_0000082c;
  Mat *in_stack_00000830;
  Mat *in_stack_00000838;
  int in_stack_00000c00;
  int in_stack_00000c04;
  int in_stack_00000c08;
  int in_stack_00000c0c;
  Mat *in_stack_00000c10;
  Mat *in_stack_00000c18;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  Mat *in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  void **ppvVar9;
  Option *in_stack_fffffffffffff8f8;
  void **ppvVar10;
  Mat *in_stack_fffffffffffff900;
  Mat *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined8 in_stack_fffffffffffff930;
  int in_stack_fffffffffffff938;
  int in_stack_fffffffffffff93c;
  undefined8 in_stack_fffffffffffff940;
  long *plVar11;
  int *in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff958;
  int *in_stack_fffffffffffff960;
  int iVar12;
  undefined8 in_stack_fffffffffffff968;
  int local_5f8;
  void *local_5f0;
  int *local_5e8;
  undefined8 local_5e0;
  undefined4 local_5d8;
  long *local_5d0;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined8 local_5b0;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined4 local_588;
  long *local_580;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined8 local_560;
  void *local_558;
  int *local_550;
  long local_548;
  undefined4 local_540;
  long *local_538;
  undefined4 local_530;
  int local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  long local_518;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc [2];
  int local_4d4;
  int local_4d0;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined8 local_480;
  void *local_478;
  int *local_470;
  long local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  long local_438;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c [2];
  int local_404;
  int local_400;
  int local_3fc;
  byte *local_3f8;
  void **local_3e0;
  undefined8 *local_3d8;
  void **local_3c8;
  undefined8 *local_3b8;
  void **local_3a8;
  void **local_398;
  long *local_388;
  long *local_380;
  undefined1 local_375;
  int local_374;
  long *local_370;
  undefined8 *local_368;
  undefined1 local_355;
  int local_354;
  long *local_350;
  undefined8 *local_348;
  undefined4 local_338;
  int local_334;
  undefined8 *local_330;
  void **local_328;
  undefined4 local_320;
  int local_31c;
  undefined8 *local_318;
  void **local_310;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  int local_2b8;
  undefined4 local_2b4;
  void **local_2b0;
  undefined8 *local_290;
  int local_278;
  undefined4 local_274;
  void **local_270;
  undefined8 *local_250;
  int local_248;
  undefined4 local_244;
  undefined8 *local_240;
  int local_238;
  undefined4 local_234;
  undefined8 *local_230;
  int local_228;
  undefined4 local_224;
  undefined8 *local_220;
  int local_218;
  undefined4 local_214;
  void **local_210;
  void **local_208;
  void **local_200;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  int local_1e8;
  undefined4 local_1e4;
  long *local_1e0;
  long *local_1d8;
  long *local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  long *local_1c0;
  long *local_1b8;
  long *local_1b0;
  long *local_1a8;
  long local_1a0;
  void **local_198;
  long local_190;
  long *local_188;
  long *local_180;
  undefined4 local_174;
  long local_170;
  long local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  long *local_148;
  undefined4 local_13c;
  long local_138;
  long local_130;
  undefined4 local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  long *local_f0;
  undefined4 local_e4;
  long local_e0;
  void *local_d8;
  undefined4 local_d0;
  int local_cc;
  void **local_c8;
  long *local_c0;
  undefined4 local_b4;
  long local_b0;
  void *local_a8;
  undefined4 local_a0;
  int local_9c;
  void **local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_58;
  void *local_38;
  void *local_28;
  
  iVar12 = (int)in_stack_fffffffffffff968;
  local_3f8 = in_RSI;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 0) {
    local_3fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
    local_400 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
    in_stack_fffffffffffff8e0 = *(undefined4 *)(in_RSI + 4);
    get_optimal_tile_mnk
              ((int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
               in_stack_fffffffffffff93c,in_stack_fffffffffffff938,
               (int)((ulong)in_stack_fffffffffffff930 >> 0x20),(int)in_stack_fffffffffffff930,
               in_stack_fffffffffffff950,in_stack_fffffffffffff958,in_stack_fffffffffffff960,iVar12)
    ;
    local_410 = (local_3fc + local_404 + -1) / local_404;
    Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                (size_t)in_stack_fffffffffffff8e8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_380 = in_RDI + 2;
    bVar8 = true;
    if (*local_380 != 0) {
      bVar8 = in_RDI[10] * (long)(int)in_RDI[9] == 0;
      local_1b8 = local_380;
    }
    if (bVar8) {
      return -100;
    }
    for (local_414 = 0; iVar12 = (int)in_stack_fffffffffffff968, local_414 < local_410;
        local_414 = local_414 + 1) {
      local_418 = local_414 * local_404;
      for (local_41c = 0; local_41c < local_400; local_41c = local_40c[0] + local_41c) {
        local_424 = local_3fc - local_418;
        piVar5 = std::min<int>(&local_424,&local_404);
        local_420 = *piVar5;
        local_42c = local_400 - local_41c;
        piVar5 = std::min<int>(&local_42c,local_40c);
        local_428 = *piVar5;
        local_350 = in_RDI + 2;
        local_354 = local_418 / local_404;
        local_348 = &local_4c0;
        local_154 = *(int *)((long)in_RDI + 0x3c);
        local_158 = (int)in_RDI[8];
        local_15c = *(undefined4 *)((long)in_RDI + 0x44);
        local_168 = *local_350 + in_RDI[10] * (long)local_354 * in_RDI[4];
        local_170 = in_RDI[4];
        local_174 = (undefined4)in_RDI[5];
        local_180 = (long *)in_RDI[6];
        local_150 = &local_4c0;
        local_f8 = (long)local_154 * (long)local_158 * local_170;
        local_31c = local_41c / local_40c[0];
        local_310 = &local_478;
        local_318 = &local_4c0;
        local_d8 = (void *)(local_168 + (long)local_154 * (long)local_31c * local_170);
        local_c8 = &local_478;
        local_438 = (long)local_154;
        local_3d8 = &local_4c0;
        local_440 = 1;
        local_444 = 1;
        local_448 = 1;
        local_450 = 2;
        local_470 = (int *)0x0;
        local_d0 = 1;
        local_fc = 0x10;
        local_320 = 1;
        local_355 = 1;
        local_4c0 = 0;
        local_4b0 = 0;
        local_4a8 = 0;
        local_498 = 0;
        local_494 = 0;
        local_490 = 0;
        local_48c = 0;
        local_488 = 0;
        local_480 = 0;
        local_4b8 = 0;
        local_250 = local_3d8;
        local_f0 = local_180;
        local_e4 = local_174;
        local_e0 = local_170;
        local_cc = local_154;
        local_4a0 = local_180;
        local_478 = local_d8;
        local_468 = local_170;
        local_460 = local_174;
        local_458 = local_180;
        local_44c = local_154;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          pack_A_tile((Mat *)C2.elemsize,(Mat *)C2.refcount,C2.data._4_4_,(int)C2.data,size,i_1);
        }
        else {
          transpose_pack_A_tile
                    (in_stack_00000c18,in_stack_00000c10,in_stack_00000c0c,in_stack_00000c08,
                     in_stack_00000c04,in_stack_00000c00);
        }
        local_3c8 = &local_478;
        local_270 = local_3c8;
        if (local_470 != (int *)0x0) {
          local_274 = 0xffffffff;
          LOCK();
          local_278 = *local_470;
          *local_470 = *local_470 + -1;
          UNLOCK();
          if (local_278 == 1) {
            if (local_458 == (long *)0x0) {
              local_58 = local_478;
              if (local_478 != (void *)0x0) {
                free(local_478);
              }
            }
            else {
              (**(code **)(*local_458 + 0x18))(local_458,local_478);
            }
          }
        }
        local_478 = (void *)0x0;
        local_468 = 0;
        local_460 = 0;
        local_450 = 0;
        local_44c = 0;
        local_448 = 0;
        local_444 = 0;
        local_440 = 0;
        local_438 = 0;
        local_470 = (int *)0x0;
      }
    }
    if ((*local_3f8 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x118);
      local_220 = puVar6;
      if (*(long *)((long)in_RDI + lVar2 + 0x120) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x120);
        local_224 = 0xffffffff;
        LOCK();
        local_228 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (*(long *)((long)in_RDI + lVar2 + 0x138) == 0) {
            local_80 = (void *)*puVar6;
            if (local_80 != (void *)0x0) {
              free(local_80);
            }
          }
          else {
            plVar7 = *(long **)((long)in_RDI + lVar2 + 0x138);
            (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x128) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x130) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x140) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x144) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x148) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x14c) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x150) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x158) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x120) = 0;
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0) {
    local_4d0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
    local_4d4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
    in_stack_fffffffffffff8e0 = *(undefined4 *)(local_3f8 + 4);
    get_optimal_tile_mnk
              ((int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
               in_stack_fffffffffffff93c,in_stack_fffffffffffff938,
               (int)((ulong)in_stack_fffffffffffff930 >> 0x20),(int)in_stack_fffffffffffff930,
               in_stack_fffffffffffff950,in_stack_fffffffffffff958,in_stack_fffffffffffff960,iVar12)
    ;
    local_4e4 = (local_4d0 + local_4dc[0] + -1) / local_4dc[0];
    local_4e8 = (local_4d4 + local_4e0 + -1) / local_4e0;
    Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                (size_t)in_stack_fffffffffffff8e8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    local_388 = in_RDI + 0xb;
    bVar8 = true;
    if (*local_388 != 0) {
      bVar8 = in_RDI[0x13] * (long)(int)in_RDI[0x12] == 0;
      local_1b0 = local_388;
    }
    if (bVar8) {
      return -100;
    }
    local_4ec = local_4e4 * local_4e8;
    for (local_4f0 = 0; local_4f0 < local_4ec; local_4f0 = local_4f0 + 1) {
      local_4f4 = local_4f0 / local_4e8;
      local_4f8 = local_4f0 % local_4e8;
      local_4fc = local_4f4 * local_4dc[0];
      local_500 = local_4f8 * local_4e0;
      local_508 = local_4d0 - local_4fc;
      piVar5 = std::min<int>(&local_508,local_4dc);
      local_504 = *piVar5;
      local_510 = local_4d4 - local_500;
      piVar5 = std::min<int>(&local_510,&local_4e0);
      local_50c = *piVar5;
      local_370 = in_RDI + 0xb;
      local_374 = local_4fc / local_4dc[0];
      local_368 = &local_5a0;
      local_11c = *(int *)((long)in_RDI + 0x84);
      local_120 = (int)in_RDI[0x11];
      local_124 = *(undefined4 *)((long)in_RDI + 0x8c);
      local_130 = *local_370 + in_RDI[0x13] * (long)local_374 * in_RDI[0xd];
      local_138 = in_RDI[0xd];
      local_13c = (undefined4)in_RDI[0xe];
      local_148 = (long *)in_RDI[0xf];
      local_118 = &local_5a0;
      local_108 = (long)local_11c * (long)local_120 * local_138;
      local_334 = local_500 / local_4e0;
      local_328 = &local_558;
      local_330 = &local_5a0;
      local_a8 = (void *)(local_130 + (long)local_11c * (long)local_334 * local_138);
      local_98 = &local_558;
      local_518 = (long)local_11c;
      local_3b8 = &local_5a0;
      local_520 = 1;
      local_524 = 1;
      local_528 = 1;
      local_530 = 2;
      local_550 = (int *)0x0;
      local_a0 = 1;
      local_10c = 0x10;
      local_338 = 1;
      local_375 = 1;
      local_5a0 = 0;
      local_590 = 0;
      local_588 = 0;
      local_578 = 0;
      local_574 = 0;
      local_570 = 0;
      local_56c = 0;
      local_568 = 0;
      local_560 = 0;
      local_598 = 0;
      local_290 = local_3b8;
      local_c0 = local_148;
      local_b4 = local_13c;
      local_b0 = local_138;
      local_9c = local_11c;
      local_580 = local_148;
      local_558 = local_a8;
      local_548 = local_138;
      local_540 = local_13c;
      local_538 = local_148;
      local_52c = local_11c;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        transpose_pack_B_tile
                  (in_stack_00000838,in_stack_00000830,in_stack_0000082c,in_stack_00000828,
                   in_stack_00000824,in_stack_00000820);
      }
      else {
        pack_B_tile(in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001b8,
                    in_stack_000001b4,in_stack_000001b0);
      }
      ppvVar10 = &local_558;
      local_3a8 = ppvVar10;
      local_2b0 = ppvVar10;
      if (local_550 != (int *)0x0) {
        local_2b4 = 0xffffffff;
        LOCK();
        local_2b8 = *local_550;
        *local_550 = *local_550 + -1;
        UNLOCK();
        if (local_2b8 == 1) {
          if (local_538 == (long *)0x0) {
            local_38 = local_558;
            if (local_558 != (void *)0x0) {
              free(local_558);
            }
          }
          else {
            (**(code **)(*local_538 + 0x18))(local_538,local_558);
          }
        }
      }
      *ppvVar10 = (void *)0x0;
      ppvVar10[2] = (void *)0x0;
      *(undefined4 *)(ppvVar10 + 3) = 0;
      *(undefined4 *)(ppvVar10 + 5) = 0;
      *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
      *(undefined4 *)(ppvVar10 + 6) = 0;
      *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
      *(undefined4 *)(ppvVar10 + 7) = 0;
      ppvVar10[8] = (void *)0x0;
      ppvVar10[1] = (void *)0x0;
    }
    if ((*local_3f8 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x160);
      local_230 = puVar6;
      if (*(long *)((long)in_RDI + lVar2 + 0x168) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x168);
        local_234 = 0xffffffff;
        LOCK();
        local_238 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_238 == 1) {
          if (*(long *)((long)in_RDI + lVar2 + 0x180) == 0) {
            local_78 = (void *)*puVar6;
            if (local_78 != (void *)0x0) {
              free(local_78);
            }
          }
          else {
            plVar7 = *(long **)((long)in_RDI + lVar2 + 0x180);
            (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      puVar6[2] = 0;
      *(undefined4 *)(puVar6 + 3) = 0;
      *(undefined4 *)(puVar6 + 5) = 0;
      *(undefined4 *)((long)puVar6 + 0x2c) = 0;
      *(undefined4 *)(puVar6 + 6) = 0;
      *(undefined4 *)((long)puVar6 + 0x34) = 0;
      *(undefined4 *)(puVar6 + 7) = 0;
      puVar6[8] = 0;
      puVar6[1] = 0;
    }
  }
  iVar12 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) != -1)) {
    lVar2 = *(long *)(*in_RDI + -0x18);
    local_1e0 = (long *)((long)in_RDI + lVar2 + 0x1a8);
    plVar7 = in_RDI + 0x14;
    local_1d8 = plVar7;
    if (plVar7 != local_1e0) {
      if (*(long *)((long)in_RDI + lVar2 + 0x1b0) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x1b0);
        local_1e4 = 1;
        LOCK();
        local_1e8 = *piVar5;
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      plVar11 = plVar7;
      local_1c0 = plVar7;
      if (in_RDI[0x15] != 0) {
        piVar5 = (int *)in_RDI[0x15];
        local_1c4 = 0xffffffff;
        LOCK();
        local_1c8 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_1c8 == 1) {
          if (in_RDI[0x18] == 0) {
            local_90 = (void *)*plVar7;
            if (local_90 != (void *)0x0) {
              free(local_90);
            }
          }
          else {
            (**(code **)(*(long *)in_RDI[0x18] + 0x18))((long *)in_RDI[0x18],*plVar7);
          }
        }
      }
      *plVar11 = 0;
      plVar11[2] = 0;
      *(undefined4 *)(plVar11 + 3) = 0;
      *(undefined4 *)(plVar11 + 5) = 0;
      *(undefined4 *)((long)plVar11 + 0x2c) = 0;
      *(undefined4 *)(plVar11 + 6) = 0;
      *(undefined4 *)((long)plVar11 + 0x34) = 0;
      *(undefined4 *)(plVar11 + 7) = 0;
      plVar11[8] = 0;
      plVar11[1] = 0;
      *plVar7 = *local_1e0;
      in_RDI[0x15] = local_1e0[1];
      in_RDI[0x16] = local_1e0[2];
      *(int *)(in_RDI + 0x17) = (int)local_1e0[3];
      in_RDI[0x18] = local_1e0[4];
      *(int *)(in_RDI + 0x19) = (int)local_1e0[5];
      *(undefined4 *)((long)in_RDI + 0xcc) = *(undefined4 *)((long)local_1e0 + 0x2c);
      *(int *)(in_RDI + 0x1a) = (int)local_1e0[6];
      *(undefined4 *)((long)in_RDI + 0xd4) = *(undefined4 *)((long)local_1e0 + 0x34);
      *(int *)(in_RDI + 0x1b) = (int)local_1e0[7];
      in_RDI[0x1c] = local_1e0[8];
    }
    local_1d0 = plVar7;
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 3) &&
       ((local_3f8[0x27] & 1) != 0)) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) % 0x10 == 0) {
        local_5a4 = 0x10;
      }
      else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) % 8 == 0) {
        local_5a4 = 8;
      }
      else {
        local_5a4 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) % 4 == 0) {
          local_5a4 = 4;
        }
      }
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                      in_stack_fffffffffffff908,iVar12,in_stack_fffffffffffff8f8);
    }
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      local_3e0 = &local_5f0;
      local_5f0 = (void *)0x0;
      local_5e8 = (int *)0x0;
      local_5e0 = 0;
      local_5d8 = 0;
      local_5d0 = (long *)0x0;
      local_5c8 = 0;
      local_5c4 = 0;
      local_5c0 = 0;
      local_5bc = 0;
      local_5b8 = 0;
      local_5b0 = 0;
      Mat::create_like(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                       (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      local_1a8 = in_RDI + 0x14;
      lVar2 = in_RDI[0x1c];
      lVar3 = in_RDI[0x1b];
      lVar4 = in_RDI[0x17];
      for (local_5f8 = 0; local_5f8 < (int)lVar2 * (int)lVar3 * (int)lVar4;
          local_5f8 = local_5f8 + 1) {
        local_188 = in_RDI + 0x14;
        local_190 = (long)local_5f8;
        local_1a0 = (long)local_5f8;
        local_198 = &local_5f0;
        *(float *)((long)local_5f0 + local_1a0 * 4) =
             *(float *)(*local_188 + local_190 * 4) *
             *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      }
      ppvVar10 = (void **)(in_RDI + 0x14);
      local_210 = &local_5f0;
      local_208 = ppvVar10;
      if (ppvVar10 != local_210) {
        if (local_5e8 != (int *)0x0) {
          local_214 = 1;
          LOCK();
          local_218 = *local_5e8;
          *local_5e8 = *local_5e8 + 1;
          UNLOCK();
        }
        ppvVar9 = ppvVar10;
        local_1f0 = ppvVar10;
        if (in_RDI[0x15] != 0) {
          piVar5 = (int *)in_RDI[0x15];
          local_1f4 = 0xffffffff;
          LOCK();
          local_1f8 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (local_1f8 == 1) {
            if (in_RDI[0x18] == 0) {
              local_88 = *ppvVar10;
              if (local_88 != (void *)0x0) {
                free(local_88);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[0x18] + 0x18))((long *)in_RDI[0x18],*ppvVar10);
            }
          }
        }
        *ppvVar10 = (void *)0x0;
        ppvVar10[2] = (void *)0x0;
        *(undefined4 *)(ppvVar10 + 3) = 0;
        *(undefined4 *)(ppvVar10 + 5) = 0;
        *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
        *(undefined4 *)(ppvVar10 + 6) = 0;
        *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
        *(undefined4 *)(ppvVar10 + 7) = 0;
        ppvVar10[8] = (void *)0x0;
        ppvVar10[1] = (void *)0x0;
        *ppvVar9 = *local_210;
        ppvVar9[1] = local_210[1];
        ppvVar9[2] = local_210[2];
        *(undefined4 *)(ppvVar9 + 3) = *(undefined4 *)(local_210 + 3);
        ppvVar9[4] = local_210[4];
        *(undefined4 *)(ppvVar9 + 5) = *(undefined4 *)(local_210 + 5);
        *(undefined4 *)((long)ppvVar9 + 0x2c) = *(undefined4 *)((long)local_210 + 0x2c);
        *(undefined4 *)(ppvVar9 + 6) = *(undefined4 *)(local_210 + 6);
        *(undefined4 *)((long)ppvVar9 + 0x34) = *(undefined4 *)((long)local_210 + 0x34);
        *(undefined4 *)(ppvVar9 + 7) = *(undefined4 *)(local_210 + 7);
        ppvVar9[8] = local_210[8];
        ppvVar10 = ppvVar9;
      }
      ppvVar9 = &local_5f0;
      local_398 = ppvVar9;
      local_2d0 = ppvVar9;
      local_200 = ppvVar10;
      if (local_5e8 != (int *)0x0) {
        local_2d4 = 0xffffffff;
        LOCK();
        local_2d8 = *local_5e8;
        *local_5e8 = *local_5e8 + -1;
        UNLOCK();
        if (local_2d8 == 1) {
          if (local_5d0 == (long *)0x0) {
            local_28 = local_5f0;
            if (local_5f0 != (void *)0x0) {
              free(local_5f0);
            }
          }
          else {
            (**(code **)(*local_5d0 + 0x18))(local_5d0,local_5f0);
          }
        }
      }
      *ppvVar9 = (void *)0x0;
      ppvVar9[2] = (void *)0x0;
      *(undefined4 *)(ppvVar9 + 3) = 0;
      *(undefined4 *)(ppvVar9 + 5) = 0;
      *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
      *(undefined4 *)(ppvVar9 + 6) = 0;
      *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
      *(undefined4 *)(ppvVar9 + 7) = 0;
      ppvVar9[8] = (void *)0x0;
      ppvVar9[1] = (void *)0x0;
    }
    if ((*local_3f8 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x1a8);
      if (*(long *)((long)in_RDI + lVar2 + 0x1b0) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x1b0);
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (local_248 == 1) {
          local_240 = puVar6;
          if (*(long *)((long)in_RDI + lVar2 + 0x1c8) == 0) {
            local_70 = (void *)*puVar6;
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            plVar7 = *(long **)((long)in_RDI + lVar2 + 0x1c8);
            (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      puVar6[2] = 0;
      *(undefined4 *)(puVar6 + 3) = 0;
      *(undefined4 *)(puVar6 + 5) = 0;
      *(undefined4 *)((long)puVar6 + 0x2c) = 0;
      *(undefined4 *)(puVar6 + 6) = 0;
      *(undefined4 *)((long)puVar6 + 0x34) = 0;
      *(undefined4 *)(puVar6 + 7) = 0;
      puVar6[8] = 0;
      puVar6[1] = 0;
    }
  }
  if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 0) ||
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0)) {
    *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(local_3f8 + 4);
  }
  return 0;
}

Assistant:

int Gemm_x86_avx512::create_pipeline(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
        {
            A_data.release();
        }
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
        {
            B_data.release();
        }
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
        {
            C_data.release();
        }
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}